

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcread.c
# Opt level: O0

void bcread_fill(LexState *ls,MSize len,int need)

{
  char *pcVar1;
  uint uVar2;
  uint local_74;
  char *pcStack_60;
  MSize n;
  char *p;
  size_t sz;
  char *buf;
  int need_local;
  MSize len_local;
  LexState *ls_local;
  SBuf *local_30;
  char *local_28;
  uint local_1c;
  SBuf *local_18;
  char *local_10;
  
  buf._0_4_ = need;
  buf._4_4_ = len;
  _need_local = ls;
  if ((0x7fffff00 < len) || (ls->c < 0)) {
    bcread_error(ls,LJ_ERR_BCBAD);
  }
  do {
    pcStack_60 = (_need_local->sb).b;
    uVar2 = (int)_need_local->pe - (int)_need_local->p;
    if (uVar2 != 0) {
      if ((int)(_need_local->sb).w == (int)(_need_local->sb).b) {
        local_18 = &_need_local->sb;
        local_1c = buf._4_4_;
        if ((uint)((int)(_need_local->sb).e - (int)(_need_local->sb).b) < buf._4_4_) {
          local_10 = lj_buf_need2(local_18,buf._4_4_);
        }
        else {
          local_10 = (_need_local->sb).b;
        }
        pcStack_60 = local_10;
        memcpy(local_10,_need_local->p,(ulong)uVar2);
      }
      else if (_need_local->p != pcStack_60) {
        memmove(pcStack_60,_need_local->p,(ulong)uVar2);
      }
      _need_local->p = pcStack_60;
      _need_local->pe = pcStack_60 + uVar2;
    }
    (_need_local->sb).w = pcStack_60 + uVar2;
    sz = (size_t)(*_need_local->rfunc)(_need_local->L,_need_local->rdata,(size_t *)&p);
    if (((char *)sz == (char *)0x0) || (p == (char *)0x0)) {
      if ((int)buf != 0) {
        bcread_error(_need_local,LJ_ERR_BCBAD);
      }
      _need_local->c = -1;
      return;
    }
    if ((char *)(ulong)(0x7fffff00 - uVar2) <= p) {
      lj_err_mem(_need_local->L);
    }
    if (uVar2 == 0) {
      _need_local->p = (char *)sz;
      _need_local->pe = (char *)(sz + (long)p);
    }
    else {
      uVar2 = (int)p + uVar2;
      local_30 = &_need_local->sb;
      local_74 = uVar2;
      if (uVar2 < buf._4_4_) {
        local_74 = buf._4_4_;
      }
      ls_local._4_4_ = local_74;
      if ((uint)((int)(_need_local->sb).e - (int)(_need_local->sb).b) < local_74) {
        local_28 = lj_buf_need2(local_30,local_74);
      }
      else {
        local_28 = (_need_local->sb).b;
      }
      pcVar1 = local_28;
      memcpy((_need_local->sb).w,(void *)sz,(size_t)p);
      (_need_local->sb).w = pcVar1 + uVar2;
      _need_local->p = pcVar1;
      _need_local->pe = pcVar1 + uVar2;
    }
  } while ((uint)((int)_need_local->pe - (int)_need_local->p) < buf._4_4_);
  return;
}

Assistant:

static LJ_NOINLINE void bcread_fill(LexState *ls, MSize len, int need)
{
  lj_assertLS(len != 0, "empty refill");
  if (len > LJ_MAX_BUF || ls->c < 0)
    bcread_error(ls, LJ_ERR_BCBAD);
  do {
    const char *buf;
    size_t sz;
    char *p = ls->sb.b;
    MSize n = (MSize)(ls->pe - ls->p);
    if (n) {  /* Copy remainder to buffer. */
      if (sbuflen(&ls->sb)) {  /* Move down in buffer. */
	lj_assertLS(ls->pe == ls->sb.w, "bad buffer pointer");
	if (ls->p != p) memmove(p, ls->p, n);
      } else {  /* Copy from buffer provided by reader. */
	p = lj_buf_need(&ls->sb, len);
	memcpy(p, ls->p, n);
      }
      ls->p = p;
      ls->pe = p + n;
    }
    ls->sb.w = p + n;
    buf = ls->rfunc(ls->L, ls->rdata, &sz);  /* Get more data from reader. */
    if (buf == NULL || sz == 0) {  /* EOF? */
      if (need) bcread_error(ls, LJ_ERR_BCBAD);
      ls->c = -1;  /* Only bad if we get called again. */
      break;
    }
    if (sz >= LJ_MAX_BUF - n) lj_err_mem(ls->L);
    if (n) {  /* Append to buffer. */
      n += (MSize)sz;
      p = lj_buf_need(&ls->sb, n < len ? len : n);
      memcpy(ls->sb.w, buf, sz);
      ls->sb.w = p + n;
      ls->p = p;
      ls->pe = p + n;
    } else {  /* Return buffer provided by reader. */
      ls->p = buf;
      ls->pe = buf + sz;
    }
  } while ((MSize)(ls->pe - ls->p) < len);
}